

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

int doddoremarm(void)

{
  boolean bVar1;
  
  if ((taking_off == 0) && (takeoff_mask == 0)) {
    if (((((uwep == (obj *)0x0) && (uswapwep == (obj *)0x0)) && (uquiver == (obj *)0x0)) &&
        ((uamul == (obj *)0x0 && (ublindf == (obj *)0x0)))) &&
       ((uleft == (obj *)0x0 && ((uright == (obj *)0x0 && (bVar1 = wearing_armor(), bVar1 == '\0')))
        ))) {
      pline("You are not wearing anything.");
    }
    else {
      add_valid_menu_class(0);
      menu_remarm(0);
      if (takeoff_mask != 0) {
        disrobing = "disrobing";
        if ((takeoff_mask & 0xfffff8ffU) == 0) {
          disrobing = "disarming";
        }
        take_off();
      }
    }
  }
  else {
    pline("You continue %s.",disrobing);
    set_occupation(take_off,disrobing,0);
  }
  return 0;
}

Assistant:

int doddoremarm(void)
{
    if (taking_off || takeoff_mask) {
	pline("You continue %s.", disrobing);
	set_occupation(take_off, disrobing, 0);
	return 0;
    } else if (!uwep && !uswapwep && !uquiver && !uamul && !ublindf &&
		!uleft && !uright && !wearing_armor()) {
	pline("You are not wearing anything.");
	return 0;
    }

    add_valid_menu_class(0); /* reset */
    menu_remarm(0);

    if (takeoff_mask) {
	/* default activity for armor and/or accessories,
	   possibly combined with weapons */
	disrobing = "disrobing";
	/* specific activity when handling weapons only */
	if (!(takeoff_mask & ~(W_WEP|W_SWAPWEP|W_QUIVER)))
	    disrobing = "disarming";
	take_off();
    }
    /* The time to perform the command is already completely accounted for
     * in take_off(); if we return 1, that would add an extra turn to each
     * disrobe.
     */
    return 0;
}